

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-attack.c
# Opt level: O0

_Bool effect_handler_SWEEP(effect_handler_context_t *context)

{
  loc_conflict grid;
  monster *pmVar1;
  wchar_t wVar2;
  loc_conflict target;
  wchar_t i;
  _Bool fear;
  wchar_t blows;
  effect_handler_context_t *context_local;
  
  i = effect_calculate_value((effect_handler_context_t_conflict *)context,false);
  if ((context->origin).what == SRC_PLAYER) {
    while (wVar2 = i + L'\xffffffff', L'\0' < i) {
      for (target.x = L'\0'; i = wVar2, target.x < L'\b'; target.x = target.x + L'\x01') {
        grid = (loc_conflict)loc_sum(player->grid,clockwise_grid[target.x]);
        pmVar1 = square_monster((chunk *)cave,grid);
        if (pmVar1 != (monster *)0x0) {
          py_attack_real(player,grid,(_Bool *)((long)&target.y + 3));
        }
      }
    }
    context_local._7_1_ = true;
  }
  else {
    context_local._7_1_ = false;
  }
  return context_local._7_1_;
}

Assistant:

bool effect_handler_SWEEP(effect_handler_context_t *context)
{
	int blows = effect_calculate_value(context, false);
	bool fear;
	int i;
	struct loc target;

	/* Players only for now */
	if (context->origin.what != SRC_PLAYER)	return false;

	/* Doing these like >1 blows means spinning around multiple times. */
	while (blows-- > 0) {
		for (i = 0; i < 8; i++) {
			target = loc_sum(player->grid, clockwise_grid[i]);
			if (square_monster(cave, target) != NULL)
				py_attack_real(player, target, &fear);
		}
	}

	/* Should return some energy if all enemies killed and blows remain? */
	return true;
}